

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> * __thiscall
tinyusdz::GeomMesh::get_points
          (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
           *__return_storage_ptr__,GeomMesh *this,double time,TimeSampleInterpolationType interp)

{
  bool bVar1;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> val;
  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  pv;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> local_78;
  undefined1 local_60 [8];
  Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
  local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = (this->points)._attrib.has_value_;
  if (((((bVar1 != false) ||
        ((this->points)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
         _M_impl.super__Vector_impl_data._M_finish !=
         (this->points)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
         _M_impl.super__Vector_impl_data._M_start)) || ((this->points)._value_empty != false)) ||
      ((this->points)._blocked == true)) &&
     (((this->points)._blocked == false &&
      (((this->points)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->points)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
        _M_impl.super__Vector_impl_data._M_start & (bVar1 ^ 1U)) == 0)))) {
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
    ::optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                *)local_60,&(this->points)._attrib);
    if (local_60[0] == true) {
      local_78.
      super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
              ::get((Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                     *)(local_60 + 8),time,&local_78,interp);
      if (bVar1) {
        std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
        _M_move_assign(__return_storage_ptr__,&local_78);
      }
      if (local_78.
          super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.
                        super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_60[0] == true) {
      nonstd::optional_lite::detail::
      storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
      ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                        *)(local_60 + 8));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<value::point3f> GeomMesh::get_points(
    double time, value::TimeSampleInterpolationType interp) const {
  std::vector<value::point3f> dst;

  if (!points.authored() || points.is_blocked()) {
    return dst;
  }

  if (points.is_connection()) {
    // TODO: connection
    return dst;
  }

  if (auto pv = points.get_value()) {
    std::vector<value::point3f> val;
    if (pv.value().get(time, &val, interp)) {
      dst = std::move(val);
    }
  }

  return dst;
}